

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O1

ostream * operator<<(ostream *out,FlatMap<Point,_double,_PointCmp> *map)

{
  pointer ppVar1;
  ostream *poVar2;
  char *pcVar3;
  pair<Point,_double> *v;
  pointer ppVar4;
  long lVar5;
  bool bVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  ppVar4 = (map->vec_).
           super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    lVar5 = 0;
    do {
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      pcVar3 = ", ";
      if (!bVar6) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,(ulong)((uint)bVar6 * 2));
      std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
      poVar2 = operator<<(out,ppVar4->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] -> ",5);
      std::ostream::_M_insert<double>(ppVar4->second);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}